

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O0

int __thiscall agg::bezier_arc::init(bezier_arc *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  undefined7 uVar5;
  bezier_arc *pbVar4;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  bool local_a9;
  bool done;
  double prev_sweep;
  double local_sweep;
  double total_sweep;
  double sweep_angle_local;
  double start_angle_local;
  double ry_local;
  double rx_local;
  double y_local;
  double x_local;
  bezier_arc *this_local;
  
  dVar2 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  sweep_angle_local = fmod(in_XMM4_Qa,6.283185307179586);
  total_sweep = in_XMM5_Qa;
  if (6.283185307179586 <= in_XMM5_Qa) {
    total_sweep = 6.283185307179586;
  }
  if (total_sweep <= -6.283185307179586) {
    total_sweep = -6.283185307179586;
  }
  if (1e-10 <= ABS(total_sweep)) {
    local_sweep = 0.0;
    *(undefined4 *)(this + 4) = 2;
    *(undefined4 *)(this + 0xd8) = 4;
    bVar3 = false;
    do {
      if (0.0 <= total_sweep) {
        prev_sweep = 1.5707963267948966;
        dVar1 = local_sweep + 1.5707963267948966;
        if (total_sweep - 0.01 <= dVar1) {
          prev_sweep = total_sweep - local_sweep;
          bVar3 = true;
        }
      }
      else {
        prev_sweep = -1.5707963267948966;
        dVar1 = local_sweep - 1.5707963267948966;
        if (dVar1 <= total_sweep + 0.01) {
          prev_sweep = total_sweep - local_sweep;
          bVar3 = true;
        }
      }
      local_sweep = dVar1;
      arc_to_bezier(dVar2,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,sweep_angle_local,prev_sweep,
                    (double *)(this + (ulong)*(uint *)(this + 4) * 8 + -8));
      *(int *)(this + 4) = *(int *)(this + 4) + 6;
      sweep_angle_local = prev_sweep + sweep_angle_local;
      uVar5 = 0;
      local_a9 = false;
      if (!bVar3) {
        local_a9 = *(uint *)(this + 4) < 0x1a;
        uVar5 = (undefined7)((ulong)this >> 8);
      }
      pbVar4 = (bezier_arc *)CONCAT71(uVar5,local_a9);
    } while (local_a9 != false);
  }
  else {
    *(undefined4 *)(this + 4) = 4;
    *(undefined4 *)(this + 0xd8) = 2;
    dVar1 = cos(sweep_angle_local);
    *(double *)(this + 8) = in_XMM2_Qa * dVar1 + dVar2;
    dVar1 = sin(sweep_angle_local);
    *(double *)(this + 0x10) = in_XMM3_Qa * dVar1 + in_XMM1_Qa;
    dVar1 = cos(sweep_angle_local + total_sweep);
    *(double *)(this + 0x18) = in_XMM2_Qa * dVar1 + dVar2;
    dVar2 = sin(sweep_angle_local + total_sweep);
    *(double *)(this + 0x20) = in_XMM3_Qa * dVar2 + in_XMM1_Qa;
    pbVar4 = this;
  }
  return (int)pbVar4;
}

Assistant:

void bezier_arc::init(double x,  double y, 
                          double rx, double ry, 
                          double start_angle, 
                          double sweep_angle)
    {
        start_angle = fmod(start_angle, 2.0 * pi);
        if(sweep_angle >=  2.0 * pi) sweep_angle =  2.0 * pi;
        if(sweep_angle <= -2.0 * pi) sweep_angle = -2.0 * pi;

        if(fabs(sweep_angle) < 1e-10)
        {
            m_num_vertices = 4;
            m_cmd = path_cmd_line_to;
            m_vertices[0] = x + rx * cos(start_angle);
            m_vertices[1] = y + ry * sin(start_angle);
            m_vertices[2] = x + rx * cos(start_angle + sweep_angle);
            m_vertices[3] = y + ry * sin(start_angle + sweep_angle);
            return;
        }

        double total_sweep = 0.0;
        double local_sweep = 0.0;
        double prev_sweep;
        m_num_vertices = 2;
        m_cmd = path_cmd_curve4;
        bool done = false;
        do
        {
            if(sweep_angle < 0.0)
            {
                prev_sweep  = total_sweep;
                local_sweep = -pi * 0.5;
                total_sweep -= pi * 0.5;
                if(total_sweep <= sweep_angle + bezier_arc_angle_epsilon)
                {
                    local_sweep = sweep_angle - prev_sweep;
                    done = true;
                }
            }
            else
            {
                prev_sweep  = total_sweep;
                local_sweep =  pi * 0.5;
                total_sweep += pi * 0.5;
                if(total_sweep >= sweep_angle - bezier_arc_angle_epsilon)
                {
                    local_sweep = sweep_angle - prev_sweep;
                    done = true;
                }
            }

            arc_to_bezier(x, y, rx, ry, 
                          start_angle, 
                          local_sweep, 
                          m_vertices + m_num_vertices - 2);

            m_num_vertices += 6;
            start_angle += local_sweep;
        }
        while(!done && m_num_vertices < 26);
    }